

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O3

bool spvOpcodeIsReturn(Op opcode)

{
  return opcode - OpReturn < 2;
}

Assistant:

bool spvOpcodeIsReturn(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpReturn:
    case spv::Op::OpReturnValue:
      return true;
    default:
      return false;
  }
}